

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatsdServer.hpp
# Opt level: O3

void __thiscall Statsd::StatsdServer::StatsdServer(StatsdServer *this,unsigned_short port)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint *puVar5;
  long *plVar6;
  uint uVar7;
  long *plVar8;
  ulong uVar9;
  uint uVar10;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  sockaddr local_40;
  
  (this->m_errorMessage)._M_dataplus._M_p = (pointer)&(this->m_errorMessage).field_2;
  (this->m_errorMessage)._M_string_length = 0;
  (this->m_errorMessage).field_2._M_local_buf[0] = '\0';
  iVar4 = socket(2,2,0x11);
  this->m_socket = iVar4;
  if (iVar4 == -1) {
    puVar5 = (uint *)__errno_location();
    uVar1 = *puVar5;
    uVar2 = -uVar1;
    if (0 < (int)uVar1) {
      uVar2 = uVar1;
    }
    uVar10 = 1;
    if (9 < uVar2) {
      uVar9 = (ulong)uVar2;
      uVar3 = 4;
      do {
        uVar10 = uVar3;
        uVar7 = (uint)uVar9;
        if (uVar7 < 100) {
          uVar10 = uVar10 - 2;
          goto LAB_00105616;
        }
        if (uVar7 < 1000) {
          uVar10 = uVar10 - 1;
          goto LAB_00105616;
        }
        if (uVar7 < 10000) goto LAB_00105616;
        uVar9 = uVar9 / 10000;
        uVar3 = uVar10 + 4;
      } while (99999 < uVar7);
      uVar10 = uVar10 + 1;
    }
LAB_00105616:
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct((ulong)local_80,(char)uVar10 - (char)((int)uVar1 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>(local_80[0] + (uVar1 >> 0x1f),uVar10,uVar2);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)local_80,0,(char *)0x0,0x10a398);
  }
  else {
    local_40.sa_data[6] = '\0';
    local_40.sa_data[7] = '\0';
    local_40.sa_data[8] = '\0';
    local_40.sa_data[9] = '\0';
    local_40.sa_data[10] = '\0';
    local_40.sa_data[0xb] = '\0';
    local_40.sa_data[0xc] = '\0';
    local_40.sa_data[0xd] = '\0';
    local_40.sa_family = 2;
    local_40.sa_data._0_2_ = port << 8 | port >> 8;
    local_40.sa_data[2] = '\0';
    local_40.sa_data[3] = '\0';
    local_40.sa_data[4] = '\0';
    local_40.sa_data[5] = '\0';
    iVar4 = bind(iVar4,&local_40,0x10);
    if (iVar4 == 0) {
      return;
    }
    close(this->m_socket);
    this->m_socket = -1;
    puVar5 = (uint *)__errno_location();
    uVar1 = *puVar5;
    uVar2 = -uVar1;
    if (0 < (int)uVar1) {
      uVar2 = uVar1;
    }
    uVar10 = 1;
    if (9 < uVar2) {
      uVar9 = (ulong)uVar2;
      uVar3 = 4;
      do {
        uVar10 = uVar3;
        uVar7 = (uint)uVar9;
        if (uVar7 < 100) {
          uVar10 = uVar10 - 2;
          goto LAB_001055bc;
        }
        if (uVar7 < 1000) {
          uVar10 = uVar10 - 1;
          goto LAB_001055bc;
        }
        if (uVar7 < 10000) goto LAB_001055bc;
        uVar9 = uVar9 / 10000;
        uVar3 = uVar10 + 4;
      } while (99999 < uVar7);
      uVar10 = uVar10 + 1;
    }
LAB_001055bc:
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct((ulong)local_80,(char)uVar10 - (char)((int)uVar1 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>(local_80[0] + (uVar1 >> 0x1f),uVar10,uVar2);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)local_80,0,(char *)0x0,0x10a402);
  }
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_50 = *plVar8;
    lStack_48 = plVar6[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar8;
    local_60 = (long *)*plVar6;
  }
  local_58 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->m_errorMessage,(string *)&local_60);
  if (local_60 != &local_50) {
    operator_delete(local_60);
  }
  if (local_80[0] != local_70) {
    operator_delete(local_80[0]);
  }
  return;
}

Assistant:

StatsdServer(unsigned short port = 8125) noexcept {
#ifdef _WIN32
        if (!detail::WinSockSingleton::getInstance().ok()) {
            m_errorMessage = "WSAStartup failed: errno=" + std::to_string(SOCKET_ERRNO);
        }
#endif

        // Create the socket
        m_socket = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP);
        if (!detail::isValidSocket(m_socket)) {
            m_errorMessage = "socket creation failed: errno=" + std::to_string(SOCKET_ERRNO);
            return;
        }

        // Binding should be with ipv4 to all interfaces
        struct sockaddr_in address {};
        address.sin_family = AF_INET;
        address.sin_port = htons(port);
        address.sin_addr.s_addr = INADDR_ANY;

        // Try to bind
        if (bind(m_socket, reinterpret_cast<const struct sockaddr*>(&address), sizeof(address)) != 0) {
            SOCKET_CLOSE(m_socket);
            m_socket = k_invalidSocket;
            m_errorMessage = "bind failed: errno=" + std::to_string(SOCKET_ERRNO);
        }
    }